

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  uint uVar1;
  ostream *poVar2;
  bool local_39;
  char *local_38;
  char *c;
  char *last;
  bool last_is_new_line;
  int length_local;
  char *first_local;
  UpdateParser *this_local;
  
  local_39 = true;
  if (*first != '\r') {
    local_39 = *first == '\n';
  }
  local_38 = first;
  do {
    if (local_38 == first + length) {
      return true;
    }
    if ((*local_38 == '\r') || (*local_38 == '\n')) {
      if (!local_39) {
        if (((this->super_LineParser).Log != (ostream *)0x0) &&
           ((this->super_LineParser).Prefix != (char *)0x0)) {
          poVar2 = std::operator<<((this->super_LineParser).Log,(this->super_LineParser).Prefix);
          poVar2 = std::operator<<(poVar2,(string *)&(this->super_LineParser).Line);
          std::operator<<(poVar2,"\n");
        }
        uVar1 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])();
        if ((uVar1 & 1) == 0) {
          std::__cxx11::string::clear();
          return false;
        }
        std::__cxx11::string::clear();
        local_39 = true;
      }
    }
    else {
      std::__cxx11::string::append((ulong)&(this->super_LineParser).Line,'\x01');
      local_39 = false;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool ProcessChunk(const char* first, int length) override
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line.clear();
            return false;
          }

          this->Line.clear();
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }